

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

bool TryLowerConstantPushIntoBlock(RegVmLoweredBlock *lowBlock,VmValue *value)

{
  RegVmLoweredFunction *pRVar1;
  bool bVar2;
  SmallArray<unsigned_int,_256U> *this;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint elementValue;
  uint i;
  uint local_6c [3];
  undefined8 local_60;
  uint data_1 [2];
  undefined8 local_50;
  uint data [2];
  uint local_40;
  uint local_3c;
  uint local_38 [2];
  _func_int *local_30;
  RegVmLoweredModule *lowModule;
  VmConstant *constant;
  VmValue *value_local;
  RegVmLoweredBlock *lowBlock_local;
  
  constant = (VmConstant *)value;
  value_local = (VmValue *)lowBlock;
  lowModule = (RegVmLoweredModule *)getType<VmConstant>(value);
  if (lowModule != (RegVmLoweredModule *)0x0) {
    local_30 = *value_local->_vptr_VmValue;
    if ((*(byte *)((long)(lowModule->functions).little + 0xb1) & 1) != 0) {
      local_38[1] = 6;
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),local_38 + 1);
      this = (SmallArray<unsigned_int,_256U> *)(local_30 + 0x128);
      bVar2 = IsLocalScope((ScopeData *)((lowModule->functions).little[0x15]->blocks).data);
      local_38[0] = (uint)bVar2;
      SmallArray<unsigned_int,_256U>::push_back(this,local_38);
      local_3c = *(int *)((long)((lowModule->functions).little[0x15]->blocks).little + 0x1c) +
                 *(int *)((lowModule->functions).little + 0xf);
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&local_3c);
      local_40 = *(uint *)((long)&(lowModule->functions).data + 4);
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&local_40);
      return true;
    }
    bVar2 = VmType::operator==((VmType *)&lowModule->functions,&VmType::Int);
    if (bVar2) {
      data[1] = 4;
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),data + 1);
      data[0] = *(uint *)((lowModule->functions).little + 0xf);
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),data);
      return true;
    }
    bVar2 = VmType::operator==((VmType *)&lowModule->functions,&VmType::Double);
    if (bVar2) {
      local_50 = (lowModule->functions).little[0x10];
      data_1[1] = 4;
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),data_1 + 1);
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),(uint *)&local_50);
      data_1[0] = 4;
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),data_1);
      SmallArray<unsigned_int,_256U>::push_back
                ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),(uint *)((long)&local_50 + 4))
      ;
      return true;
    }
    bVar2 = VmType::operator==((VmType *)&lowModule->functions,&VmType::Long);
    if (bVar2) {
      pRVar1 = (lowModule->functions).little[0x11];
      local_60._4_4_ = (int)((ulong)pRVar1 >> 0x20);
      local_60 = pRVar1;
      if (local_60._4_4_ == 0) {
        local_6c[2] = 5;
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),local_6c + 2);
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),(uint *)&local_60);
      }
      else {
        local_6c[1] = 4;
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),local_6c + 1);
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),(uint *)&local_60);
        local_6c[0] = 4;
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),local_6c);
        SmallArray<unsigned_int,_256U>::push_back
                  ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),
                   (uint *)((long)&local_60 + 4));
      }
      return true;
    }
    if (*(int *)&(lowModule->functions).data == 6) {
      if ((lowModule->functions).little[0x15] == (RegVmLoweredFunction *)0x0) {
        if (*(int *)((lowModule->functions).little + 0xf) == 0) {
          i = 5;
          SmallArray<unsigned_int,_256U>::push_back
                    ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&i);
          elementValue = 0;
          SmallArray<unsigned_int,_256U>::push_back
                    ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&elementValue);
          return true;
        }
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x1cc,"bool TryLowerConstantPushIntoBlock(RegVmLoweredBlock *, VmValue *)");
      }
    }
    else if (*(int *)&(lowModule->functions).data == 0xb) {
      if (((ulong)(lowModule->functions).data & 0x300000000) == 0) {
        for (local_78 = 0; local_78 < *(uint *)((long)&(lowModule->functions).data + 4) >> 2;
            local_78 = local_78 + 1) {
          local_7c = *(uint *)((long)((lowModule->functions).little[0x12]->blocks).little +
                              ((ulong)(local_78 << 2) - 0x20));
          local_80 = 4;
          SmallArray<unsigned_int,_256U>::push_back
                    ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&local_80);
          SmallArray<unsigned_int,_256U>::push_back
                    ((SmallArray<unsigned_int,_256U> *)(local_30 + 0x128),&local_7c);
        }
        return true;
      }
      __assert_fail("constant->type.size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x1de,"bool TryLowerConstantPushIntoBlock(RegVmLoweredBlock *, VmValue *)");
    }
  }
  return false;
}

Assistant:

bool TryLowerConstantPushIntoBlock(RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		RegVmLoweredModule *lowModule = lowBlock->parent->parent;

		if(constant->isReference)
		{
			lowModule->constants.push_back(rvmiPushMem);
			lowModule->constants.push_back(IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals);
			lowModule->constants.push_back(constant->container->offset + constant->iValue);
			lowModule->constants.push_back(int(constant->type.size));

			return true;
		}

		if(constant->type == VmType::Int)
		{
			lowModule->constants.push_back(rvmiPushImm);
			lowModule->constants.push_back(constant->iValue);

			return true;
		}
		else if(constant->type == VmType::Double)
		{
			unsigned data[2];
			memcpy(data, &constant->dValue, 8);

			lowModule->constants.push_back(rvmiPushImm);
			lowModule->constants.push_back(data[0]);

			lowModule->constants.push_back(rvmiPushImm);
			lowModule->constants.push_back(data[1]);

			return true;
		}
		else if(constant->type == VmType::Long)
		{
			unsigned data[2];
			memcpy(data, &constant->lValue, 8);

			if(data[1] == 0)
			{
				lowModule->constants.push_back(rvmiPushImmq);
				lowModule->constants.push_back(data[0]);
			}
			else
			{
				lowModule->constants.push_back(rvmiPushImm);
				lowModule->constants.push_back(data[0]);

				lowModule->constants.push_back(rvmiPushImm);
				lowModule->constants.push_back(data[1]);
			}

			return true;
		}
		else if(constant->type.type == VM_TYPE_POINTER)
		{
			if(!constant->container)
			{
				assert(constant->iValue == 0);

				if(NULLC_PTR_SIZE == 8)
				{
					lowModule->constants.push_back(rvmiPushImmq);
					lowModule->constants.push_back(0);
				}
				else
				{
					lowModule->constants.push_back(rvmiPushImm);
					lowModule->constants.push_back(0);
				}

				return true;
			}
		}
		else if(constant->type.type == VM_TYPE_STRUCT)
		{
			assert(constant->type.size % 4 == 0);

			for(unsigned i = 0; i < constant->type.size / 4; i++)
			{
				unsigned elementValue;
				memcpy(&elementValue, constant->sValue + i * 4, 4);

				lowModule->constants.push_back(rvmiPushImm);
				lowModule->constants.push_back(elementValue);
			}

			return true;
		}
	}

	return false;
}